

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_frame_flags(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  char cVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  undefined8 *local_40;
  AV1Decoder *pbi;
  int *arg;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t *ctx_local;
  aom_codec_err_t local_4;
  
  uVar2 = args->gp_offset;
  if (uVar2 < 0x29) {
    local_40 = (undefined8 *)((long)(int)uVar2 + (long)args->reg_save_area);
    args->gp_offset = uVar2 + 8;
  }
  else {
    local_40 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = local_40 + 1;
  }
  puVar3 = (uint *)*local_40;
  if (puVar3 == (uint *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (ctx->frame_worker == (AVxWorker *)0x0) {
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    lVar4 = *ctx->frame_worker->data1;
    *puVar3 = 0;
    cVar1 = *(char *)(lVar4 + 0x3b60);
    if (cVar1 == '\0') {
      *puVar3 = *puVar3 | 1;
      *puVar3 = *puVar3 | 0x10;
      if (*(int *)(lVar4 + 0x3d40) == 0) {
        *puVar3 = *puVar3 | 0x80;
      }
    }
    else if (cVar1 == '\x02') {
      *puVar3 = *puVar3 | 0x10;
    }
    else if (cVar1 == '\x03') {
      *puVar3 = *puVar3 | 0x20;
    }
    if ((*(byte *)(lVar4 + 0x3d56) & 1) != 0) {
      *puVar3 = *puVar3 | 0x40;
    }
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_frame_flags(aom_codec_alg_priv_t *ctx,
                                            va_list args) {
  int *const arg = va_arg(args, int *);
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  if (ctx->frame_worker == NULL) return AOM_CODEC_ERROR;
  AV1Decoder *pbi = ((FrameWorkerData *)ctx->frame_worker->data1)->pbi;
  *arg = 0;
  switch (pbi->common.current_frame.frame_type) {
    case KEY_FRAME:
      *arg |= AOM_FRAME_IS_KEY;
      *arg |= AOM_FRAME_IS_INTRAONLY;
      if (!pbi->common.show_frame) {
        *arg |= AOM_FRAME_IS_DELAYED_RANDOM_ACCESS_POINT;
      }
      break;
    case INTRA_ONLY_FRAME: *arg |= AOM_FRAME_IS_INTRAONLY; break;
    case S_FRAME: *arg |= AOM_FRAME_IS_SWITCH; break;
  }
  if (pbi->common.features.error_resilient_mode) {
    *arg |= AOM_FRAME_IS_ERROR_RESILIENT;
  }
  return AOM_CODEC_OK;
}